

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O1

void Gia_ManAigPrintPiLevels(Gia_Man_t *p)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  size_t __size;
  int iVar8;
  long lVar9;
  
  pVVar4 = p->vCis;
  uVar6 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar9 = 0;
    do {
      if ((int)uVar6 <= lVar9) goto LAB_007aacc3;
      uVar2 = pVVar4->pArray[lVar9];
      if (((int)uVar2 < 0) || (p->nObjs <= (int)uVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pVVar4 = p->vLevels;
      if (pVVar4->nSize <= (int)uVar2) {
        lVar1 = (ulong)uVar2 + 1;
        iVar3 = pVVar4->nCap;
        iVar7 = iVar3 * 2;
        iVar8 = (int)lVar1;
        if ((int)uVar2 < iVar7) {
          if (iVar3 < iVar7 && iVar3 <= (int)uVar2) {
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc((long)iVar3 << 3);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,(long)iVar3 << 3);
            }
            pVVar4->pArray = piVar5;
LAB_007aac16:
            if (piVar5 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar4->nCap = iVar7;
          }
        }
        else if (iVar3 <= (int)uVar2) {
          __size = lVar1 * 4;
          if (pVVar4->pArray == (int *)0x0) {
            piVar5 = (int *)malloc(__size);
          }
          else {
            piVar5 = (int *)realloc(pVVar4->pArray,__size);
          }
          pVVar4->pArray = piVar5;
          iVar7 = iVar8;
          goto LAB_007aac16;
        }
        iVar3 = pVVar4->nSize;
        if (iVar3 <= (int)uVar2) {
          memset(pVVar4->pArray + iVar3,0,(ulong)(uVar2 - iVar3) * 4 + 4);
        }
        pVVar4->nSize = iVar8;
      }
      if (pVVar4->nSize <= (int)uVar2) {
LAB_007aacc3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      printf("%d ",(ulong)(uint)pVVar4->pArray[uVar2]);
      lVar9 = lVar9 + 1;
      pVVar4 = p->vCis;
      uVar6 = (ulong)pVVar4->nSize;
    } while (lVar9 < (long)(uVar6 - (long)p->nRegs));
  }
  putchar(10);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Synthesis script.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManAigPrintPiLevels( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachPi( p, pObj, i )
        printf( "%d ", Gia_ObjLevel(p, pObj) );
    printf( "\n" );
}